

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_server.cc
# Opt level: O0

void __thiscall raptor::TcpServer::OnConnectionClosed(TcpServer *this,ConnectionId cid)

{
  TcpMessageNode *this_00;
  TcpMessageNode *msg;
  ConnectionId cid_local;
  TcpServer *this_local;
  
  this_00 = (TcpMessageNode *)operator_new(0x58);
  TcpMessageNode::TcpMessageNode(this_00);
  this_00->cid = cid;
  this_00->type = kCloseClient;
  MultiProducerSingleConsumerQueue::push(&this->_mpscq,(Node *)this_00);
  Atomic<unsigned_int>::FetchAdd<int>(&this->_count,1,ACQ_REL);
  ConditionVariable::Signal(&this->_cv);
  return;
}

Assistant:

void TcpServer::OnConnectionClosed(ConnectionId cid) {
    TcpMessageNode* msg = new TcpMessageNode;
    msg->cid = cid;
    msg->type = MessageType::kCloseClient;
    _mpscq.push(&msg->node);
    _count.FetchAdd(1, MemoryOrder::ACQ_REL);
    _cv.Signal();
}